

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void mbedtls_sha256_finish(mbedtls_sha256_context *ctx,uchar *output)

{
  uint uVar1;
  int iVar2;
  uchar msglen [8];
  
  uVar1 = ctx->total[0];
  iVar2 = ctx->total[1] << 3;
  msglen[3] = (byte)iVar2 | (byte)(uVar1 >> 0x1d);
  msglen[7] = (char)uVar1 * '\b';
  msglen[0] = (uchar)((uint)iVar2 >> 0x18);
  msglen[1] = (uchar)((uint)iVar2 >> 0x10);
  msglen[2] = (uchar)((uint)iVar2 >> 8);
  msglen[4] = (uchar)(uVar1 >> 0x15);
  msglen[5] = (uchar)(uVar1 >> 0xd);
  msglen[6] = (uchar)(uVar1 >> 5);
  mbedtls_sha256_update
            (ctx,sha256_padding,
             (ulong)(((uint)(0x37 < (uVar1 & 0x3f)) << 6 | 0x38) - (uVar1 & 0x3f)));
  mbedtls_sha256_update(ctx,msglen,8);
  *output = *(uchar *)((long)ctx->state + 3);
  output[1] = *(uchar *)((long)ctx->state + 2);
  output[2] = *(uchar *)((long)ctx->state + 1);
  output[3] = (uchar)ctx->state[0];
  output[4] = *(uchar *)((long)ctx->state + 7);
  output[5] = *(uchar *)((long)ctx->state + 6);
  output[6] = *(uchar *)((long)ctx->state + 5);
  output[7] = (uchar)ctx->state[1];
  output[8] = *(uchar *)((long)ctx->state + 0xb);
  output[9] = *(uchar *)((long)ctx->state + 10);
  output[10] = *(uchar *)((long)ctx->state + 9);
  output[0xb] = (uchar)ctx->state[2];
  output[0xc] = *(uchar *)((long)ctx->state + 0xf);
  output[0xd] = *(uchar *)((long)ctx->state + 0xe);
  output[0xe] = *(uchar *)((long)ctx->state + 0xd);
  output[0xf] = (uchar)ctx->state[3];
  output[0x10] = *(uchar *)((long)ctx->state + 0x13);
  output[0x11] = *(uchar *)((long)ctx->state + 0x12);
  output[0x12] = *(uchar *)((long)ctx->state + 0x11);
  output[0x13] = (uchar)ctx->state[4];
  output[0x14] = *(uchar *)((long)ctx->state + 0x17);
  output[0x15] = *(uchar *)((long)ctx->state + 0x16);
  output[0x16] = *(uchar *)((long)ctx->state + 0x15);
  output[0x17] = (uchar)ctx->state[5];
  output[0x18] = *(uchar *)((long)ctx->state + 0x1b);
  output[0x19] = *(uchar *)((long)ctx->state + 0x1a);
  output[0x1a] = *(uchar *)((long)ctx->state + 0x19);
  output[0x1b] = (uchar)ctx->state[6];
  if (ctx->is224 == 0) {
    output[0x1c] = *(uchar *)((long)ctx->state + 0x1f);
    output[0x1d] = *(uchar *)((long)ctx->state + 0x1e);
    output[0x1e] = *(uchar *)((long)ctx->state + 0x1d);
    output[0x1f] = (uchar)ctx->state[7];
  }
  return;
}

Assistant:

void mbedtls_sha256_finish( mbedtls_sha256_context *ctx, unsigned char output[32] )
{
    uint32_t last, padn;
    uint32_t high, low;
    unsigned char msglen[8];

    high = ( ctx->total[0] >> 29 )
         | ( ctx->total[1] <<  3 );
    low  = ( ctx->total[0] <<  3 );

    PUT_UINT32_BE( high, msglen, 0 );
    PUT_UINT32_BE( low,  msglen, 4 );

    last = ctx->total[0] & 0x3F;
    padn = ( last < 56 ) ? ( 56 - last ) : ( 120 - last );

    mbedtls_sha256_update( ctx, sha256_padding, padn );
    mbedtls_sha256_update( ctx, msglen, 8 );

    PUT_UINT32_BE( ctx->state[0], output,  0 );
    PUT_UINT32_BE( ctx->state[1], output,  4 );
    PUT_UINT32_BE( ctx->state[2], output,  8 );
    PUT_UINT32_BE( ctx->state[3], output, 12 );
    PUT_UINT32_BE( ctx->state[4], output, 16 );
    PUT_UINT32_BE( ctx->state[5], output, 20 );
    PUT_UINT32_BE( ctx->state[6], output, 24 );

    if( ctx->is224 == 0 )
        PUT_UINT32_BE( ctx->state[7], output, 28 );
}